

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

void __thiscall phosg::StringReader::skip(StringReader *this,size_t bytes)

{
  out_of_range *this_00;
  ulong uVar1;
  
  uVar1 = bytes + this->offset;
  this->offset = uVar1;
  if (uVar1 <= this->length) {
    return;
  }
  this->offset = this->length;
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"skip beyond end of string");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

void StringReader::skip(size_t bytes) {
  this->offset += bytes;
  if (this->offset > this->length) {
    this->offset = this->length;
    throw out_of_range("skip beyond end of string");
  }
}